

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cLayoutBindingTests.cpp
# Opt level: O0

String * __thiscall
glcts::ImageLayoutBindingCase::buildLayout
          (String *__return_storage_ptr__,ImageLayoutBindingCase *this,String *binding)

{
  ulong uVar1;
  ostream *poVar2;
  undefined1 local_198 [8];
  ostringstream s;
  String *binding_local;
  ImageLayoutBindingCase *this_local;
  
  s._368_8_ = binding;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)local_198,"layout(binding=");
    poVar2 = std::operator<<(poVar2,(string *)s._368_8_);
    std::operator<<(poVar2,", rgba8) readonly ");
  }
  else {
    std::operator<<((ostream *)local_198,"layout(rgba8) readonly ");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
  return __return_storage_ptr__;
}

Assistant:

String buildLayout(const String& binding)
	{
		std::ostringstream s;
		if (!binding.empty())
			s << "layout(binding=" << binding << ", rgba8) readonly ";
		else
			s << "layout(rgba8) readonly ";
		return s.str();
	}